

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
::rebalance_or_split
          (btree<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
           *this,iterator *iter)

{
  field_type fVar1;
  field_type fVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  short sVar6;
  uint uVar7;
  slot_type *dest;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
  *pbVar8;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
  *pbVar9;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
  *pbVar10;
  btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
  *pbVar11;
  uint *puVar12;
  uint *puVar13;
  uint *puVar14;
  slot_type *psVar15;
  slot_type *psVar16;
  slot_type *psVar17;
  template_ElementType<1UL> *ptVar18;
  allocator_type *in_RCX;
  allocator_type *paVar19;
  int **args;
  ushort uVar20;
  int **n;
  size_type sVar21;
  allocator_type *in_R9;
  int iVar22;
  uint uVar23;
  slot_type *src;
  size_type sVar24;
  long lVar25;
  int iVar26;
  iterator parent_iter;
  
  fVar1 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
          ::count(iter->node);
  fVar2 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
          ::max_count(iter->node);
  if (fVar1 != fVar2) {
    __assert_fail("node->count() == node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb53,
                  "void phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                 );
  }
  fVar1 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
          ::max_count(iter->node);
  if (fVar1 != '=') {
    __assert_fail("kNodeValues == node->max_count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb54,
                  "void phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                 );
  }
  pbVar8 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
           ::parent(iter->node);
  if (iter->node ==
      (this->root_).
      super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>_*>
      .
      super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>_*>
      .
      super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>_*>
      .
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>_*,_false>
      ._M_head_impl) {
    pbVar8 = new_internal_node(this,pbVar8);
    btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
    ::init_child(pbVar8,0,(this->root_).
                          super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>_*>
                          .
                          super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>_*>
                          .
                          super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>_*>
                          .
                          super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>_*,_false>
                          ._M_head_impl);
    (this->root_).
    super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>_*,_false>
    ._M_head_impl = pbVar8;
    pbVar9 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
             ::child(pbVar8,0);
    bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
            ::leaf(pbVar9);
    if ((bVar5) &&
       (pbVar9 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                 ::child(pbVar8,0), pbVar9 != this->rightmost_)) {
      __assert_fail("!parent->child(0)->leaf() || parent->child(0) == rightmost_",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xba0,
                    "void phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                   );
    }
  }
  else {
    fVar1 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
            ::position(iter->node);
    if (fVar1 != '\0') {
      bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
              ::position(iter->node);
      pbVar9 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
               ::child(pbVar8,(ulong)bVar3 - 1);
      fVar1 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
              ::max_count(pbVar9);
      if (fVar1 != '=') {
        __assert_fail("left->max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xb5c,
                      "void phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                     );
      }
      bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
              ::count(pbVar9);
      if (bVar3 < 0x3d) {
        bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                ::count(pbVar9);
        uVar7 = iter->position;
        in_RCX = (allocator_type *)(ulong)uVar7;
        uVar23 = (int)(short)(0x3d - (ushort)bVar3) / (int)(short)(((int)uVar7 < 0x3d) + 1);
        sVar21 = 1;
        if (1 < (short)uVar23) {
          sVar21 = (size_type)(uVar23 & 0xffff);
        }
        iVar26 = (int)sVar21;
        if ((iVar26 <= (int)uVar7) ||
           (bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::count(pbVar9), (uint)bVar3 + iVar26 < 0x3d)) {
          pbVar8 = iter->node;
          pbVar10 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::parent(pbVar9);
          pbVar11 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::parent(pbVar8);
          if (pbVar10 != pbVar11) {
            __assert_fail("parent() == right->parent()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x87f,
                          "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                         );
          }
          bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                  ::position(pbVar9);
          bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                  ::position(pbVar8);
          if (bVar3 + 1 != (uint)bVar4) {
            __assert_fail("position() + 1 == right->position()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x880,
                          "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                         );
          }
          bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                  ::count(pbVar8);
          bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                  ::count(pbVar9);
          if (bVar3 < bVar4) {
            __assert_fail("right->count() >= count()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x881,
                          "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                         );
          }
          bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                  ::count(pbVar8);
          if ((ushort)sVar21 <= (ushort)bVar3) {
            bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::count(pbVar9);
            pbVar10 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::parent(pbVar9);
            bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::position(pbVar9);
            parent_iter.node =
                 (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                  *)btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::slot(pbVar10,(ulong)bVar4);
            btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::IntCompareToCmp,std::allocator<int>,256,true>>
            ::value_init<int*>((btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::IntCompareToCmp,std::allocator<int>,256,true>>
                                *)pbVar9,(ulong)bVar3,(allocator_type *)&parent_iter,(int **)in_RCX)
            ;
            bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::count(pbVar9);
            btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
            ::uninitialized_move_n(pbVar8,(ulong)(iVar26 - 1),0,(ulong)bVar3 + 1,pbVar9,in_R9);
            puVar12 = (uint *)btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                              ::slot(pbVar8,(ulong)(iVar26 - 1));
            pbVar10 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::parent(pbVar9);
            bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::position(pbVar9);
            puVar13 = (uint *)btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                              ::slot(pbVar10,(ulong)bVar3);
            paVar19 = (allocator_type *)(ulong)*puVar12;
            *puVar13 = *puVar12;
            puVar12 = (uint *)btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                              ::slot(pbVar8,sVar21);
            bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::count(pbVar8);
            puVar13 = (uint *)btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                              ::slot(pbVar8,(ulong)bVar3);
            puVar14 = (uint *)btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                              ::slot(pbVar8,0);
            for (; puVar12 != puVar13; puVar12 = puVar12 + 1) {
              paVar19 = (allocator_type *)(ulong)*puVar12;
              *puVar14 = *puVar12;
              puVar14 = puVar14 + 1;
            }
            bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::count(pbVar8);
            btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
            ::value_destroy_n(pbVar8,(long)(int)((uint)bVar3 - iVar26),sVar21,paVar19);
            bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::leaf(pbVar9);
            if (!bVar5) {
              for (sVar24 = 0; sVar21 != sVar24; sVar24 = sVar24 + 1) {
                bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                        ::count(pbVar9);
                pbVar10 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                          ::child(pbVar8,sVar24);
                btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                ::init_child(pbVar9,(uint)bVar3 + (int)sVar24 + 1,pbVar10);
              }
              for (lVar25 = 0;
                  bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                          ::count(pbVar8), lVar25 <= (int)((uint)bVar3 - iVar26);
                  lVar25 = lVar25 + 1) {
                sVar24 = sVar21 + lVar25;
                bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                        ::max_count(pbVar8);
                if ((int)(uint)bVar3 < (int)sVar24) {
                  __assert_fail("i + to_move <= right->max_count()",
                                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                                ,0x89c,
                                "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                               );
                }
                pbVar10 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                          ::child(pbVar8,sVar24);
                btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                ::init_child(pbVar8,(int)lVar25,pbVar10);
                btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                ::mutable_child(pbVar8,sVar24);
              }
            }
            fVar1 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::count(pbVar9);
            ptVar18 = btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::IntCompareToCmp,std::allocator<int>,256,true>>
                      ::GetField<1ul>((btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::IntCompareToCmp,std::allocator<int>,256,true>>
                                       *)pbVar9);
            ptVar18[2] = fVar1 + (char)sVar21;
            fVar1 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::count(pbVar8);
            ptVar18 = btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::IntCompareToCmp,std::allocator<int>,256,true>>
                      ::GetField<1ul>((btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::IntCompareToCmp,std::allocator<int>,256,true>>
                                       *)pbVar8);
            ptVar18[2] = fVar1 - (char)sVar21;
            bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::max_count(iter->node);
            bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::count(iter->node);
            if ((uint)bVar3 - (uint)bVar4 == iVar26) {
              iVar26 = iter->position - iVar26;
              iter->position = iVar26;
              if (iVar26 < 0) {
                bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                        ::count(pbVar9);
                iter->position = (uint)bVar3 + iVar26 + 1;
                iter->node = pbVar9;
              }
              else {
                pbVar9 = iter->node;
              }
              bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::count(pbVar9);
              bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::max_count(iter->node);
              if (bVar3 < bVar4) {
                return;
              }
              __assert_fail("node->count() < node->max_count()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0xb70,
                            "void phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                           );
            }
            __assert_fail("node->max_count() - node->count() == to_move",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xb69,
                          "void phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                         );
          }
          __assert_fail("to_move <= right->count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x883,
                        "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                       );
        }
      }
    }
    bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
            ::position(iter->node);
    bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
            ::count(pbVar8);
    if (bVar3 < bVar4) {
      bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
              ::position(iter->node);
      pbVar9 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
               ::child(pbVar8,(ulong)bVar3 + 1);
      fVar1 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
              ::max_count(pbVar9);
      if (fVar1 != '=') {
        __assert_fail("right->max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xb79,
                      "void phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                     );
      }
      bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
              ::count(pbVar9);
      if (bVar3 < 0x3d) {
        bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                ::count(pbVar9);
        uVar7 = 0x3d - bVar3;
        iVar26 = iter->position;
        sVar6 = (short)((int)((uint)(ushort)((short)uVar7 >> 0xf) << 0x10 | uVar7 & 0xffff) /
                       (int)(short)((0 < iVar26) + 1));
        paVar19 = (allocator_type *)0x1;
        if (1 < sVar6) {
          paVar19 = (allocator_type *)(ulong)CONCAT22((short)(uVar7 >> 0x10),sVar6);
        }
        n = (int **)((ulong)paVar19 & 0xffff);
        in_RCX = paVar19;
        bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                ::count(iter->node);
        uVar7 = (uint)n;
        if ((iVar26 <= (int)(bVar3 - uVar7)) ||
           (bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::count(pbVar9), bVar3 + uVar7 < 0x3d)) {
          pbVar8 = iter->node;
          pbVar10 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::parent(pbVar8);
          pbVar11 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::parent(pbVar9);
          if (pbVar10 != pbVar11) {
            __assert_fail("parent() == right->parent()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x8ab,
                          "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                         );
          }
          bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                  ::position(pbVar8);
          bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                  ::position(pbVar9);
          if (bVar3 + 1 != (uint)bVar4) {
            __assert_fail("position() + 1 == right->position()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x8ac,
                          "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                         );
          }
          bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                  ::count(pbVar8);
          bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                  ::count(pbVar9);
          if (bVar3 < bVar4) {
            __assert_fail("count() >= right->count()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0x8ad,
                          "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                         );
          }
          bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                  ::count(pbVar8);
          uVar20 = (ushort)paVar19;
          if (uVar20 <= bVar3) {
            bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::count(pbVar9);
            if (bVar3 < uVar20) {
              bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::count(pbVar9);
              args = n;
              btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
              ::uninitialized_move_n(pbVar9,(ulong)bVar3,0,(size_type)n,pbVar9,in_R9);
              pbVar10 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                        ::parent(pbVar8);
              bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::position(pbVar8);
              parent_iter.node =
                   (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    *)btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::slot(pbVar10,(ulong)bVar3);
              btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::IntCompareToCmp,std::allocator<int>,256,true>>
              ::value_init<int*>((btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::IntCompareToCmp,std::allocator<int>,256,true>>
                                  *)pbVar9,(ulong)(uVar7 - 1),(allocator_type *)&parent_iter,args);
              bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::count(pbVar9);
              sVar21 = (size_type)(int)(~(uint)bVar3 + uVar7);
              bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::count(pbVar8);
              bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::count(pbVar9);
              btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
              ::uninitialized_move_n(pbVar8,sVar21,bVar3 - sVar21,(ulong)bVar4,pbVar9,in_R9);
              bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::count(pbVar8);
              psVar15 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                        ::slot(pbVar8,(long)(int)((uint)bVar3 - (uVar7 - 1)));
              bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::count(pbVar8);
              psVar16 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                        ::slot(pbVar8,bVar3 - sVar21);
              psVar17 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                        ::slot(pbVar9,0);
              for (; psVar15 != psVar16; psVar15 = psVar15 + 1) {
                *psVar17 = *psVar15;
                psVar17 = psVar17 + 1;
              }
            }
            else {
              bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::count(pbVar9);
              bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::count(pbVar9);
              btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
              ::uninitialized_move_n
                        (pbVar9,(size_type)n,(long)(int)(bVar3 - uVar7),(ulong)bVar4,pbVar9,in_R9);
              bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::count(pbVar9);
              if (uVar20 < bVar3) {
                bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                        ::count(pbVar9);
                psVar15 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                          ::slot(pbVar9,(long)(int)(~uVar7 + (uint)bVar3));
                bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                        ::count(pbVar9);
                psVar16 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                          ::slot(pbVar9,(ulong)bVar3 - 1);
                psVar17 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                          ::slot(pbVar9,0);
                for (; psVar17 <= psVar15; psVar15 = psVar15 + -1) {
                  *psVar16 = *psVar15;
                  psVar16 = psVar16 + -1;
                }
              }
              pbVar10 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                        ::parent(pbVar8);
              bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::position(pbVar8);
              psVar15 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                        ::slot(pbVar10,(ulong)bVar3);
              psVar16 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                        ::slot(pbVar9,(ulong)(uVar7 - 1));
              *psVar16 = *psVar15;
              bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::count(pbVar8);
              psVar15 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                        ::slot(pbVar8,(long)(int)((uint)bVar3 - (uVar7 - 1)));
              bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::count(pbVar8);
              psVar16 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                        ::slot(pbVar8,(ulong)bVar3);
              psVar17 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                        ::slot(pbVar9,0);
              for (; psVar15 != psVar16; psVar15 = psVar15 + 1) {
                *psVar17 = *psVar15;
                psVar17 = psVar17 + 1;
              }
            }
            bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::count(pbVar8);
            puVar12 = (uint *)btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                              ::slot(pbVar8,(long)(int)(bVar3 - uVar7));
            pbVar10 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::parent(pbVar8);
            bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::position(pbVar8);
            puVar13 = (uint *)btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                              ::slot(pbVar10,(ulong)bVar3);
            paVar19 = (allocator_type *)(ulong)*puVar12;
            *puVar13 = *puVar12;
            bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::count(pbVar8);
            btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
            ::value_destroy_n(pbVar8,(long)(int)(bVar3 - uVar7),(size_type)n,paVar19);
            bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::leaf(pbVar8);
            if (!bVar5) {
              bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::count(pbVar9);
              for (uVar23 = (uint)bVar3; -1 < (int)uVar23; uVar23 = uVar23 - 1) {
                pbVar10 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                          ::child(pbVar9,(ulong)uVar23);
                btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                ::init_child(pbVar9,uVar7 + uVar23,pbVar10);
                btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                ::mutable_child(pbVar9,(ulong)uVar23);
              }
              iVar26 = 1;
              iVar22 = -uVar7;
              while (iVar22 = iVar22 + 1, iVar22 != 1) {
                bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                        ::count(pbVar8);
                pbVar10 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                          ::child(pbVar8,(long)(int)((uint)bVar3 + iVar22));
                btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                ::init_child(pbVar9,iVar26 + -1,pbVar10);
                bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                        ::count(pbVar8);
                btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                ::mutable_child(pbVar8,(long)(int)((uint)bVar3 + iVar22));
                iVar26 = iVar26 + 1;
              }
            }
            fVar1 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::count(pbVar8);
            ptVar18 = btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::IntCompareToCmp,std::allocator<int>,256,true>>
                      ::GetField<1ul>((btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::IntCompareToCmp,std::allocator<int>,256,true>>
                                       *)pbVar8);
            ptVar18[2] = fVar1 - (char)n;
            fVar1 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::count(pbVar9);
            ptVar18 = btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::IntCompareToCmp,std::allocator<int>,256,true>>
                      ::GetField<1ul>((btree_node<phmap::priv::set_params<int,phmap::priv::(anonymous_namespace)::IntCompareToCmp,std::allocator<int>,256,true>>
                                       *)pbVar9);
            ptVar18[2] = fVar1 + (char)n;
            iVar26 = iter->position;
            bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::count(iter->node);
            pbVar8 = iter->node;
            if ((int)(uint)bVar3 < iVar26) {
              iVar26 = iter->position;
              bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                      ::count(pbVar8);
              iter->position = ~(uint)bVar3 + iVar26;
              iter->node = pbVar9;
              pbVar8 = pbVar9;
            }
            bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::count(pbVar8);
            bVar4 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
                    ::max_count(iter->node);
            if (bVar3 < bVar4) {
              return;
            }
            __assert_fail("node->count() < node->max_count()",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                          ,0xb8b,
                          "void phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                         );
          }
          __assert_fail("to_move <= count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x8af,
                        "void phmap::priv::btree_node<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                       );
        }
      }
    }
    fVar1 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
            ::max_count(pbVar8);
    if (fVar1 != '=') {
      __assert_fail("parent->max_count() == kNodeValues",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0xb93,
                    "void phmap::priv::btree<phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>>::rebalance_or_split(iterator *) [Params = phmap::priv::set_params<int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<int>, 256, true>]"
                   );
    }
    fVar1 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
            ::count(pbVar8);
    if (fVar1 == '=') {
      pbVar9 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
               ::parent(iter->node);
      bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
              ::position(iter->node);
      parent_iter.position = (int)bVar3;
      parent_iter.node = pbVar9;
      rebalance_or_split(this,&parent_iter);
    }
  }
  bVar5 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
          ::leaf(iter->node);
  if (bVar5) {
    sVar21 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
             ::LeafSize(0x3d);
    pbVar9 = (btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
              *)Allocate<8ul,std::allocator<int>>((allocator<int> *)this,sVar21);
    btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
    ::init_leaf(pbVar9,pbVar8,0x3d);
    btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
    ::split(iter->node,iter->position,pbVar9,in_RCX);
    if (this->rightmost_ == iter->node) {
      this->rightmost_ = pbVar9;
    }
  }
  else {
    pbVar9 = new_internal_node(this,pbVar8);
    btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
    ::split(iter->node,iter->position,pbVar9,in_RCX);
  }
  iVar26 = iter->position;
  bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
          ::count(iter->node);
  if ((int)(uint)bVar3 < iVar26) {
    iVar26 = iter->position;
    bVar3 = btree_node<phmap::priv::set_params<int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<int>,_256,_true>_>
            ::count(iter->node);
    iter->position = ~(uint)bVar3 + iVar26;
    iter->node = pbVar9;
  }
  return;
}

Assistant:

void btree<P>::rebalance_or_split(iterator *iter) {
        node_type *&node = iter->node;
        int &insert_position = iter->position;
        assert(node->count() == node->max_count());
        assert(kNodeValues == node->max_count());

        // First try to make room on the node by rebalancing.
        node_type *parent = node->parent();
        if (node != root()) {
            if (node->position() > 0) {
                // Try rebalancing with our left sibling.
                node_type *left = parent->child(node->position() - 1);
                assert(left->max_count() == kNodeValues);
                if (left->count() < kNodeValues) {
                    // We bias rebalancing based on the position being inserted. If we're
                    // inserting at the end of the right node then we bias rebalancing to
                    // fill up the left node.
                    int to_move = (kNodeValues - left->count()) /
                        (1 + (insert_position < kNodeValues));
                    to_move = (std::max)(1, to_move);

                    if (((insert_position - to_move) >= 0) ||
                        ((left->count() + to_move) < kNodeValues)) {
                        left->rebalance_right_to_left(to_move, node, mutable_allocator());

                        assert(node->max_count() - node->count() == to_move);
                        insert_position = insert_position - to_move;
                        if (insert_position < 0) {
                            insert_position = insert_position + left->count() + 1;
                            node = left;
                        }

                        assert(node->count() < node->max_count());
                        return;
                    }
                }
            }

            if (node->position() < parent->count()) {
                // Try rebalancing with our right sibling.
                node_type *right = parent->child(node->position() + 1);
                assert(right->max_count() == kNodeValues);
                if (right->count() < kNodeValues) {
                    // We bias rebalancing based on the position being inserted. If we're
                    // inserting at the _beginning of the left node then we bias rebalancing
                    // to fill up the right node.
                    int to_move =
                        (kNodeValues - right->count()) / (1 + (insert_position > 0));
                    to_move = (std::max)(1, to_move);

                    if ((insert_position <= (node->count() - to_move)) ||
                        ((right->count() + to_move) < kNodeValues)) {
                        node->rebalance_left_to_right(to_move, right, mutable_allocator());

                        if (insert_position > node->count()) {
                            insert_position = insert_position - node->count() - 1;
                            node = right;
                        }

                        assert(node->count() < node->max_count());
                        return;
                    }
                }
            }

            // Rebalancing failed, make sure there is room on the parent node for a new
            // value.
            assert(parent->max_count() == kNodeValues);
            if (parent->count() == kNodeValues) {
                iterator parent_iter(node->parent(), node->position());
                rebalance_or_split(&parent_iter);
            }
        } else {
            // Rebalancing not possible because this is the root node.
            // Create a new root node and set the current root node as the child of the
            // new root.
            parent = new_internal_node(parent);
            parent->init_child(0, root());
            mutable_root() = parent;
            // If the former root was a leaf node, then it's now the rightmost node.
            assert(!parent->child(0)->leaf() || parent->child(0) == rightmost_);
        }

        // Split the node.
        node_type *split_node;
        if (node->leaf()) {
            split_node = new_leaf_node(parent);
            node->split(insert_position, split_node, mutable_allocator());
            if (rightmost_ == node) rightmost_ = split_node;
        } else {
            split_node = new_internal_node(parent);
            node->split(insert_position, split_node, mutable_allocator());
        }

        if (insert_position > node->count()) {
            insert_position = insert_position - node->count() - 1;
            node = split_node;
        }
    }